

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::indexStructBufferContent
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *buffer)

{
  TIntermediate *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_01;
  size_type sVar3;
  TIntermConstantUnion *index;
  TIntermTyped *pTVar4;
  const_reference pvVar5;
  TIntermTyped *argArray;
  TIntermTyped *arrayPosition;
  TTypeList *bufferStruct;
  TIntermTyped *buffer_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  if (buffer != (TIntermTyped *)0x0) {
    iVar2 = (*(buffer->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar1 = isStructBufferType(this,(TType *)CONCAT44(extraout_var,iVar2));
    if (bVar1) {
      iVar2 = (*(buffer->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      this_01 = &TType::getStruct((TType *)CONCAT44(extraout_var_00,iVar2))->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      sVar3 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (this_01);
      index = TIntermediate::addConstantUnion(this_00,(int)sVar3 - 1,loc,false);
      pTVar4 = TIntermediate::addIndex
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          EOpIndexDirectStruct,buffer,&index->super_TIntermTyped,loc);
      sVar3 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (this_01);
      pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](this_01,sVar3 - 1);
      (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar4,pvVar5->type);
      return pTVar4;
    }
  }
  return (TIntermTyped *)0x0;
}

Assistant:

TIntermTyped* HlslParseContext::indexStructBufferContent(const TSourceLoc& loc, TIntermTyped* buffer) const
{
    // Bail out if not a struct buffer
    if (buffer == nullptr || ! isStructBufferType(buffer->getType()))
        return nullptr;

    // Runtime sized array is always the last element.
    const TTypeList* bufferStruct = buffer->getType().getStruct();
    TIntermTyped* arrayPosition = intermediate.addConstantUnion(unsigned(bufferStruct->size()-1), loc);

    TIntermTyped* argArray = intermediate.addIndex(EOpIndexDirectStruct, buffer, arrayPosition, loc);
    argArray->setType(*(*bufferStruct)[bufferStruct->size()-1].type);

    return argArray;
}